

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult GenValidUsageInputsXrEnumerateEnvironmentBlendModes
                   (XrInstance instance,XrSystemId systemId,
                   XrViewConfigurationType viewConfigurationType,
                   uint32_t environmentBlendModeCapacityInput,
                   uint32_t *environmentBlendModeCountOutput,
                   XrEnvironmentBlendMode *environmentBlendModes)

{
  bool bVar1;
  ValidateXrHandleResult VVar2;
  GenValidUsageXrInstanceInfo *pGVar3;
  allocator local_651;
  string local_650 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_630;
  allocator local_611;
  string local_610 [39];
  allocator local_5e9;
  string local_5e8 [39];
  allocator local_5c1;
  string local_5c0 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_5a0;
  allocator local_581;
  string local_580 [39];
  allocator local_559;
  string local_558 [32];
  string local_538 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_518;
  allocator local_4f9;
  string local_4f8 [39];
  allocator local_4d1;
  string local_4d0 [32];
  string local_4b0 [32];
  ostringstream local_490 [8];
  ostringstream oss_enum;
  allocator local_311;
  string local_310 [39];
  allocator local_2e9;
  string local_2e8 [39];
  allocator local_2c1;
  string local_2c0 [32];
  GenValidUsageXrInstanceInfo *local_2a0;
  GenValidUsageXrInstanceInfo *gen_instance_info;
  string local_290 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_270;
  allocator local_251;
  string local_250 [39];
  allocator local_229;
  string local_228 [32];
  XrInstance_T local_208 [32];
  ostringstream local_1e8 [8];
  ostringstream oss;
  ValidateXrHandleResult handle_result;
  XrObjectType local_5c;
  undefined1 local_58 [8];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  XrResult xr_result;
  XrEnvironmentBlendMode *environmentBlendModes_local;
  uint32_t *environmentBlendModeCountOutput_local;
  uint32_t environmentBlendModeCapacityInput_local;
  XrViewConfigurationType viewConfigurationType_local;
  XrSystemId systemId_local;
  XrInstance instance_local;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
  systemId_local = (XrSystemId)instance;
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_58);
  local_5c = XR_OBJECT_TYPE_INSTANCE;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrInstance_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)local_58
             ,(XrInstance_T **)&systemId_local,&local_5c);
  VVar2 = VerifyXrInstanceHandle((XrInstance *)&systemId_local);
  if (VVar2 == VALIDATE_XR_HANDLE_SUCCESS) {
    pGVar3 = HandleInfoBase<XrInstance_T_*,_GenValidUsageXrInstanceInfo>::get
                       (&g_instance_info.
                         super_HandleInfoBase<XrInstance_T_*,_GenValidUsageXrInstanceInfo>,
                        (XrInstance_T *)systemId_local);
    local_2a0 = pGVar3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2c0,"xrEnumerateEnvironmentBlendModes",&local_2c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2e8,"xrEnumerateEnvironmentBlendModes",&local_2e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_310,"viewConfigurationType",&local_311);
    bVar1 = ValidateXrEnum(pGVar3,(string *)local_2c0,(string *)local_2e8,(string *)local_310,
                           (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            *)local_58,viewConfigurationType);
    std::__cxx11::string::~string(local_310);
    std::allocator<char>::~allocator((allocator<char> *)&local_311);
    std::__cxx11::string::~string(local_2e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
    std::__cxx11::string::~string(local_2c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
    pGVar3 = local_2a0;
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      if ((environmentBlendModeCapacityInput == 0) ||
         (environmentBlendModes != (XrEnvironmentBlendMode *)0x0)) {
        if (environmentBlendModeCountOutput == (uint32_t *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_5e8,
                     "VUID-xrEnumerateEnvironmentBlendModes-environmentBlendModeCountOutput-parameter"
                     ,&local_5e9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_610,"xrEnumerateEnvironmentBlendModes",&local_611);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    (&local_630,
                     (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)local_58);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_650,
                     "Invalid NULL for uint32_t \"environmentBlendModeCountOutput\" which is not optional and must be non-NULL"
                     ,&local_651);
          CoreValidLogMessage(pGVar3,(string *)local_5e8,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                              (string *)local_610,&local_630,(string *)local_650);
          std::__cxx11::string::~string(local_650);
          std::allocator<char>::~allocator((allocator<char> *)&local_651);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
          ~vector(&local_630);
          std::__cxx11::string::~string(local_610);
          std::allocator<char>::~allocator((allocator<char> *)&local_611);
          std::__cxx11::string::~string(local_5e8);
          std::allocator<char>::~allocator((allocator<char> *)&local_5e9);
          instance_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
          gen_instance_info._4_4_ = 1;
        }
        else {
          instance_local._4_4_ =
               objects_info.
               super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
          gen_instance_info._4_4_ = 1;
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_558,"VUID-xrEnumerateEnvironmentBlendModes-environmentBlendModes-parameter"
                   ,&local_559);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_580,"xrEnumerateEnvironmentBlendModes",&local_581);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_5a0,
                   (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   local_58);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_5c0,
                   "Command xrEnumerateEnvironmentBlendModes param environmentBlendModes is NULL, but environmentBlendModeCapacityInput is greater than 0"
                   ,&local_5c1);
        CoreValidLogMessage(pGVar3,(string *)local_558,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            (string *)local_580,&local_5a0,(string *)local_5c0);
        std::__cxx11::string::~string(local_5c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                  (&local_5a0);
        std::__cxx11::string::~string(local_580);
        std::allocator<char>::~allocator((allocator<char> *)&local_581);
        std::__cxx11::string::~string(local_558);
        std::allocator<char>::~allocator((allocator<char> *)&local_559);
        instance_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
        gen_instance_info._4_4_ = 1;
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_490);
      std::operator<<((ostream *)local_490,
                      "Invalid XrViewConfigurationType \"viewConfigurationType\" enum value ");
      Uint32ToHexString_abi_cxx11_((uint32_t)local_4b0);
      std::operator<<((ostream *)local_490,local_4b0);
      std::__cxx11::string::~string(local_4b0);
      pGVar3 = local_2a0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_4d0,"VUID-xrEnumerateEnvironmentBlendModes-viewConfigurationType-parameter",
                 &local_4d1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4f8,"xrEnumerateEnvironmentBlendModes",&local_4f9);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_518,
                 (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 local_58);
      std::__cxx11::ostringstream::str();
      CoreValidLogMessage(pGVar3,(string *)local_4d0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          (string *)local_4f8,&local_518,local_538);
      std::__cxx11::string::~string((string *)local_538);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_518);
      std::__cxx11::string::~string(local_4f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
      std::__cxx11::string::~string(local_4d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
      instance_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      gen_instance_info._4_4_ = 1;
      std::__cxx11::ostringstream::~ostringstream(local_490);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1e8);
    std::operator<<((ostream *)local_1e8,"Invalid XrInstance handle \"instance\" ");
    HandleToHexString<XrInstance_T*>(local_208);
    std::operator<<((ostream *)local_1e8,(string *)local_208);
    std::__cxx11::string::~string((string *)local_208);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_228,"VUID-xrEnumerateEnvironmentBlendModes-instance-parameter",&local_229);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_250,"xrEnumerateEnvironmentBlendModes",&local_251);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_270,
               (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               local_58);
    std::__cxx11::ostringstream::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,(string *)local_228,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,(string *)local_250,&local_270,local_290);
    std::__cxx11::string::~string((string *)local_290);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
              (&local_270);
    std::__cxx11::string::~string(local_250);
    std::allocator<char>::~allocator((allocator<char> *)&local_251);
    std::__cxx11::string::~string(local_228);
    std::allocator<char>::~allocator((allocator<char> *)&local_229);
    instance_local._4_4_ = XR_ERROR_HANDLE_INVALID;
    gen_instance_info._4_4_ = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1e8);
  }
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_58);
  return instance_local._4_4_;
}

Assistant:

XrResult GenValidUsageInputsXrEnumerateEnvironmentBlendModes(
XrInstance instance,
XrSystemId systemId,
XrViewConfigurationType viewConfigurationType,
uint32_t environmentBlendModeCapacityInput,
uint32_t* environmentBlendModeCountOutput,
XrEnvironmentBlendMode* environmentBlendModes) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(instance, XR_OBJECT_TYPE_INSTANCE);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrInstanceHandle(&instance);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrInstance handle \"instance\" ";
                oss << HandleToHexString(instance);
                CoreValidLogMessage(nullptr, "VUID-xrEnumerateEnvironmentBlendModes-instance-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrEnumerateEnvironmentBlendModes",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        GenValidUsageXrInstanceInfo *gen_instance_info = g_instance_info.get(instance);
        (void)gen_instance_info;  // quiet warnings
        // Make sure the enum type XrViewConfigurationType value is valid
        if (!ValidateXrEnum(gen_instance_info, "xrEnumerateEnvironmentBlendModes", "xrEnumerateEnvironmentBlendModes", "viewConfigurationType", objects_info, viewConfigurationType)) {
            std::ostringstream oss_enum;
            oss_enum << "Invalid XrViewConfigurationType \"viewConfigurationType\" enum value ";
            oss_enum << Uint32ToHexString(static_cast<uint32_t>(viewConfigurationType));
            CoreValidLogMessage(gen_instance_info, "VUID-xrEnumerateEnvironmentBlendModes-viewConfigurationType-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrEnumerateEnvironmentBlendModes",
                                objects_info, oss_enum.str());
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Optional array must be non-NULL when environmentBlendModeCapacityInput is non-zero
        if (0 != environmentBlendModeCapacityInput && nullptr == environmentBlendModes) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrEnumerateEnvironmentBlendModes-environmentBlendModes-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrEnumerateEnvironmentBlendModes",
                                objects_info,
                                "Command xrEnumerateEnvironmentBlendModes param environmentBlendModes is NULL, but environmentBlendModeCapacityInput is greater than 0");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == environmentBlendModeCountOutput) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrEnumerateEnvironmentBlendModes-environmentBlendModeCountOutput-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrEnumerateEnvironmentBlendModes", objects_info,
                                "Invalid NULL for uint32_t \"environmentBlendModeCountOutput\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // NOTE: Can't validate "VUID-xrEnumerateEnvironmentBlendModes-environmentBlendModeCountOutput-parameter" type
                // NOTE: Can't validate "VUID-xrEnumerateEnvironmentBlendModes-environmentBlendModes-parameter" output enum buffer
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}